

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

LogHelper * util::operator<<(LogHelper *h,colour c)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char local_19;
  
  bVar1 = is_stdout_a_tty();
  if (bVar1) {
    poVar2 = h->screen;
    if ((char)c < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[",2);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,c & 0x7f);
      pcVar4 = ";1m";
      lVar3 = 3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[0;",4);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)c);
      pcVar4 = &local_19;
      local_19 = 'm';
      lVar3 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  }
  return h;
}

Assistant:

LogHelper& operator<<(LogHelper& h, colour c)
{
    // Colours are screen only
    if (util::is_stdout_a_tty())
    {
#ifdef _WIN32
        h.screen->flush();
        SetConsoleTextAttribute(GetStdHandle(STD_OUTPUT_HANDLE), static_cast<int>(c));
#else
        auto val = static_cast<int>(c);
        if (val & 0x80)
            *h.screen << "\x1b[" << (val & 0x7f) << ";1m";
        else
            *h.screen << "\x1b[0;" << (val & 0x7f) << 'm';
#endif
    }
    return h;
}